

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

UInt64 __thiscall Json::Value::asUInt64(Value *this)

{
  double dVar1;
  bool bVar2;
  UInt64 UVar3;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  UVar3 = (UInt64)(byte)this->field_0x8;
  switch(UVar3) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt64(this);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,"LargestInt out of UInt64 range",0x1e);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
      goto LAB_001251a5;
    }
  case 2:
    UVar3 = (this->value_).int_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((0.0 <= dVar1) && (dVar1 <= 1.8446744073709552e+19)) {
      return (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1;
    }
LAB_001251a5:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"double out of UInt64 range",0x1a);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
switchD_0012510f_caseD_4:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to UInt64.",0x23);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_180);
    std::ios_base::~ios_base(local_110);
    _Unwind_Resume(extraout_RAX);
  default:
    goto switchD_0012510f_caseD_4;
  case 5:
    UVar3 = (UInt64)(this->value_).bool_;
  }
  return UVar3;
}

Assistant:

Value::UInt64 Value::asUInt64() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt64(), "LargestInt out of UInt64 range");
    return UInt64(value_.int_);
  case uintValue:
    return UInt64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt64),
                        "double out of UInt64 range");
    return UInt64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt64.");
}